

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall
cmMakefile::HaveCStandardAvailable(cmMakefile *this,cmTarget *target,string *feature)

{
  pointer pcVar1;
  cmMakefile *this_00;
  string *psVar2;
  char **ppcVar3;
  char *pcVar4;
  char **ppcVar5;
  ostream *poVar6;
  size_t sVar7;
  pointer __s;
  bool needC11;
  bool needC99;
  bool needC90;
  ostringstream e;
  bool local_293;
  bool local_292;
  bool local_291;
  cmMakefile *local_290;
  string local_288;
  long *local_268 [2];
  long local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_C_STANDARD_DEFAULT","")
  ;
  local_290 = this;
  psVar2 = GetDef(this,(string *)local_1a8);
  if (psVar2 == (string *)0x0) {
    __s = (char *)0x0;
  }
  else {
    __s = (psVar2->_M_dataplus)._M_p;
  }
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (__s == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "CMAKE_C_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support not fully configured for this compiler."
               ,0x66);
    std::__cxx11::stringbuf::str();
    IssueMessage(local_290,INTERNAL_ERROR,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return true;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,__s,(allocator<char> *)local_1a8);
  ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                      (C_STANDARDS,(char **)&DAT_00634eb8,(cmStrCmp *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  if (ppcVar3 == (char **)&DAT_00634eb8) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "The CMAKE_C_STANDARD_DEFAULT variable contains an invalid value: \"",0x42);
    this_00 = local_290;
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
    std::__cxx11::stringbuf::str();
    IssueMessage(this_00,INTERNAL_ERROR,&local_288);
  }
  else {
    local_291 = false;
    local_292 = false;
    local_293 = false;
    CheckNeededCLanguage(local_290,feature,&local_291,&local_292,&local_293);
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
    pcVar4 = cmTarget::GetProperty(target,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (pcVar4 != (char *)0x0) {
      __s = pcVar4;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1e8,__s,(allocator<char> *)local_1a8);
    ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_00634eb8,(cmStrCmp *)local_1e8);
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0],local_1d8[0] + 1);
    }
    if (ppcVar3 != (char **)&DAT_00634eb8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_208,__s,(allocator<char> *)local_1a8);
      ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                          (C_STANDARDS,(char **)&DAT_00634eb8,(cmStrCmp *)local_208);
      if (local_208[0] != local_1f8) {
        operator_delete(local_208[0],local_1f8[0] + 1);
      }
      if (local_293 == true) {
        local_228[0] = local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"11","");
        ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                            (C_STANDARDS,(char **)&DAT_00634eb8,(cmStrCmp *)local_228);
        if (local_228[0] != local_218) {
          operator_delete(local_228[0],local_218[0] + 1);
        }
        if (ppcVar3 < ppcVar5) {
          return false;
        }
      }
      if (local_292 == true) {
        local_248[0] = local_238;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"99","");
        ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                            (C_STANDARDS,(char **)&DAT_00634eb8,(cmStrCmp *)local_248);
        if (local_248[0] != local_238) {
          operator_delete(local_248[0],local_238[0] + 1);
        }
        if (ppcVar3 < ppcVar5) {
          return false;
        }
      }
      if (local_291 != true) {
        return true;
      }
      local_268[0] = local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"90","");
      ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                          (C_STANDARDS,(char **)&DAT_00634eb8,(cmStrCmp *)local_268);
      if (local_268[0] != local_258) {
        operator_delete(local_268[0],local_258[0] + 1);
      }
      if (ppcVar3 < ppcVar5) {
        return false;
      }
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The C_STANDARD property on target \"",0x23);
    psVar2 = cmTarget::GetName_abi_cxx11_(target);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\" contained an invalid value: \"",0x1f);
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
    std::__cxx11::stringbuf::str();
    IssueMessage(local_290,FATAL_ERROR,&local_288);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool cmMakefile::HaveCStandardAvailable(cmTarget const* target,
                                        const std::string& feature) const
{
  const char* defaultCStandard =
    this->GetDefinition("CMAKE_C_STANDARD_DEFAULT");
  if (!defaultCStandard) {
    std::ostringstream e;
    e << "CMAKE_C_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support "
         "not fully configured for this compiler.";
    this->IssueMessage(MessageType::INTERNAL_ERROR, e.str());
    // Return true so the caller does not try to lookup the default standard.
    return true;
  }
  if (std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                   cmStrCmp(defaultCStandard)) == cm::cend(C_STANDARDS)) {
    std::ostringstream e;
    e << "The CMAKE_C_STANDARD_DEFAULT variable contains an "
         "invalid value: \""
      << defaultCStandard << "\".";
    this->IssueMessage(MessageType::INTERNAL_ERROR, e.str());
    return false;
  }

  bool needC90 = false;
  bool needC99 = false;
  bool needC11 = false;

  this->CheckNeededCLanguage(feature, needC90, needC99, needC11);

  const char* existingCStandard = target->GetProperty("C_STANDARD");
  if (!existingCStandard) {
    existingCStandard = defaultCStandard;
  }

  if (std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                   cmStrCmp(existingCStandard)) == cm::cend(C_STANDARDS)) {
    std::ostringstream e;
    e << "The C_STANDARD property on target \"" << target->GetName()
      << "\" contained an invalid value: \"" << existingCStandard << "\".";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return false;
  }

  const char* const* existingCIt = existingCStandard
    ? std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                   cmStrCmp(existingCStandard))
    : cm::cend(C_STANDARDS);

  if (needC11 && existingCStandard &&
      existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                 cm::cend(C_STANDARDS), cmStrCmp("11"))) {
    return false;
  }
  if (needC99 && existingCStandard &&
      existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                 cm::cend(C_STANDARDS), cmStrCmp("99"))) {
    return false;
  }
  if (needC90 && existingCStandard &&
      existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                 cm::cend(C_STANDARDS), cmStrCmp("90"))) {
    return false;
  }
  return true;
}